

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O3

bool cfd::core::TaprootUtil::VerifyTaprootCommitment
               (bool has_parity,uint8_t tapleaf_bit,SchnorrPubkey *target_taproot,
               SchnorrPubkey *internal_pubkey,
               vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *nodes,
               Script *tapscript,ByteData256 *tapleaf_hash)

{
  pointer pBVar1;
  bool bVar2;
  pointer puVar3;
  ByteData256 *node;
  pointer commitment;
  TaprootScriptTree tree;
  ByteData256 local_e8;
  SchnorrPubkey *local_c8;
  undefined1 local_c0 [120];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_48;
  
  puVar3 = (pointer)(((long)(nodes->
                            super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(nodes->
                            super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  if (puVar3 < (pointer)0x81) {
    local_c8 = target_taproot;
    TaprootScriptTree::TaprootScriptTree((TaprootScriptTree *)local_c0,tapleaf_bit,tapscript);
    if (tapleaf_hash != (ByteData256 *)0x0) {
      TapBranch::GetBaseHash(&local_e8,(TapBranch *)local_c0);
      puVar3 = (tapleaf_hash->data_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (tapleaf_hash->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      (tapleaf_hash->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (tapleaf_hash->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
        if (local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
    }
    commitment = (nodes->
                 super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                 )._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (nodes->
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (commitment != pBVar1) {
      do {
        TapBranch::AddBranch((TapBranch *)local_c0,commitment);
        ::std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>::
        emplace_back<cfd::core::ByteData256_const&>
                  ((vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)
                   &local_48,commitment);
        commitment = commitment + 1;
      } while (commitment != pBVar1);
    }
    TapBranch::GetTapTweak(&local_e8,(TapBranch *)local_c0,internal_pubkey);
    bVar2 = SchnorrPubkey::IsTweaked(local_c8,internal_pubkey,&local_e8,has_parity);
    if (local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_c0._0_8_ = &PTR__TaprootScriptTree_006918c8;
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_48);
    TapBranch::~TapBranch((TapBranch *)local_c0);
  }
  else {
    local_c0._0_8_ = "cfdcore_taproot.cpp";
    local_c0._8_4_ = 0x25d;
    local_c0._16_8_ = "VerifyTaprootCommitment";
    local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar3;
    logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_c0,kCfdLogLevelWarning,"control node maximum over. [{}]",
               (unsigned_long *)&local_e8);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool TaprootUtil::VerifyTaprootCommitment(
    bool has_parity, uint8_t tapleaf_bit,
    const SchnorrPubkey& target_taproot,  // witness program
    const SchnorrPubkey& internal_pubkey,
    const std::vector<ByteData256>& nodes, const Script& tapscript,
    ByteData256* tapleaf_hash) {
  if (nodes.size() > TaprootScriptTree::kTaprootControlMaxNodeCount) {
    warn(CFD_LOG_SOURCE, "control node maximum over. [{}]", nodes.size());
    return false;
  }

  // Compute the tapleaf hash.
  TaprootScriptTree tree(tapleaf_bit, tapscript);
  if (tapleaf_hash != nullptr) *tapleaf_hash = tree.GetTapLeafHash();

  // Compute the Merkle root from the leaf and the provided path.
  for (const auto& node : nodes) {
    tree.AddBranch(node);
  }
  // Compute the tweak from the Merkle root and the inner pubkey.
  auto hash = tree.GetTapTweak(internal_pubkey);
  // Verify that the output pubkey matches the tweaked inner pubkey, after correcting for parity. // NOLINT
  return target_taproot.IsTweaked(internal_pubkey, hash, has_parity);
}